

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.h
# Opt level: O0

int64_t __thiscall aeron::Publication::position(Publication *this)

{
  bool bVar1;
  int32_t iVar2;
  int32_t activeTermId;
  int64_t rawTail_00;
  int32_t termOffset;
  int64_t rawTail;
  int64_t result;
  Publication *this_local;
  
  rawTail = -4;
  bVar1 = isClosed(this);
  if (!bVar1) {
    rawTail_00 = concurrent::logbuffer::LogBufferDescriptor::rawTailVolatile
                           (this->m_logMetaDataBuffer);
    iVar2 = termBufferLength(this);
    iVar2 = concurrent::logbuffer::LogBufferDescriptor::termOffset(rawTail_00,(long)iVar2);
    activeTermId = concurrent::logbuffer::LogBufferDescriptor::termId(rawTail_00);
    rawTail = concurrent::logbuffer::LogBufferDescriptor::computePosition
                        (activeTermId,iVar2,this->m_positionBitsToShift,this->m_initialTermId);
  }
  return rawTail;
}

Assistant:

inline std::int64_t position() const
    {
        std::int64_t result = PUBLICATION_CLOSED;

        if (!isClosed())
        {
            const std::int64_t rawTail = LogBufferDescriptor::rawTailVolatile(m_logMetaDataBuffer);
            const std::int32_t termOffset = LogBufferDescriptor::termOffset(rawTail, termBufferLength());

            result = LogBufferDescriptor::computePosition(
                LogBufferDescriptor::termId(rawTail), termOffset, m_positionBitsToShift, m_initialTermId);
        }

        return result;
    }